

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O0

void __thiscall helics::apps::Recorder::loadTextFile(Recorder *this,string *textFile)

{
  string_view captureDesc;
  string_view delimiters;
  string_view line;
  string_view quoteChars;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  string_view str_05;
  string_view str_06;
  string_view str_07;
  string_view str_08;
  string_view str_09;
  string_view sourceEndpoint;
  string_view destEndpoint;
  string_view sourceEndpoint_00;
  string_view destEndpoint_00;
  string_view sourceEndpoint_01;
  string_view destEndpoint_01;
  string_view endpoint;
  string_view key;
  string_view key_00;
  bool bVar1;
  istream *piVar2;
  reference pvVar3;
  char *pcVar4;
  ostream *poVar5;
  string *in_RSI;
  stringVector blk;
  size_type firstChar;
  int lineCount;
  string str;
  ifstream infile;
  undefined4 in_stack_fffffffffffffa28;
  undefined4 in_stack_fffffffffffffa2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa30;
  ostream *in_stack_fffffffffffffa38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa40;
  ostream *in_stack_fffffffffffffa48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffa50;
  ostream *in_stack_fffffffffffffa60;
  ostream *in_stack_fffffffffffffa68;
  Recorder *in_stack_fffffffffffffa70;
  undefined4 in_stack_fffffffffffffa78;
  undefined1 in_stack_fffffffffffffa7c;
  undefined1 in_stack_fffffffffffffa7d;
  undefined1 in_stack_fffffffffffffa7e;
  undefined1 in_stack_fffffffffffffa7f;
  ostream *in_stack_fffffffffffffa80;
  Recorder *in_stack_fffffffffffffa90;
  ostream *in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffaa0;
  undefined1 in_stack_fffffffffffffaa1;
  undefined1 in_stack_fffffffffffffaa2;
  undefined1 in_stack_fffffffffffffaa3;
  undefined1 in_stack_fffffffffffffaa4;
  undefined1 in_stack_fffffffffffffaa5;
  undefined1 in_stack_fffffffffffffaa6;
  undefined1 in_stack_fffffffffffffaa7;
  undefined1 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaa9;
  undefined1 in_stack_fffffffffffffaaa;
  undefined1 in_stack_fffffffffffffaab;
  undefined1 in_stack_fffffffffffffaac;
  undefined1 in_stack_fffffffffffffaad;
  undefined1 in_stack_fffffffffffffaae;
  undefined1 in_stack_fffffffffffffaaf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  size_type local_258;
  int local_23c;
  string local_238 [32];
  istream local_218 [536];
  
  std::ifstream::ifstream(local_218,in_RSI,_S_in);
  std::__cxx11::string::string(in_stack_fffffffffffffa40);
  local_23c = 0;
  do {
    do {
      piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>(local_218,local_238);
      bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar2 + *(long *)(*(long *)piVar2 + -0x18)));
      if (!bVar1) {
        std::ifstream::close();
        std::__cxx11::string::~string(in_stack_fffffffffffffa30);
        std::ifstream::~ifstream(local_218);
        return;
      }
      local_23c = local_23c + 1;
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x20e956);
    } while (((bVar1) ||
             (local_258 = CLI::std::__cxx11::
                          basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                          find_first_not_of(in_stack_fffffffffffffa50,
                                            (char *)in_stack_fffffffffffffa48,
                                            (size_type)in_stack_fffffffffffffa40),
             local_258 == 0xffffffffffffffff)) ||
            (pvVar3 = CLI::std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator[]
                                (in_stack_fffffffffffffa30,
                                 CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28)),
            *pvVar3 == '#'));
    std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffa40,
               (char *)in_stack_fffffffffffffa38);
    in_stack_fffffffffffffa28 = 3;
    in_stack_fffffffffffffa2c = 0;
    in_stack_fffffffffffffa30 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x790fff;
    line._M_str = (char *)in_stack_fffffffffffffa48;
    line._M_len = (size_t)in_stack_fffffffffffffa40;
    delimiters._M_str = (char *)in_stack_fffffffffffffa38;
    delimiters._M_len = (size_t)"\'\"`";
    quoteChars._M_str = (char *)in_stack_fffffffffffffa68;
    quoteChars._M_len = (size_t)in_stack_fffffffffffffa60;
    gmlc::utilities::stringOps::splitlineQuotes_abi_cxx11_(line,delimiters,quoteChars,on);
    pcVar4 = (char *)CLI::std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(&local_270);
    if (pcVar4 == (char *)0x1) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_270,0);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
      str_00._M_str._0_4_ = in_stack_fffffffffffffa78;
      str_00._M_len = (size_t)in_stack_fffffffffffffa70;
      str_00._M_str._4_1_ = in_stack_fffffffffffffa7c;
      str_00._M_str._5_1_ = in_stack_fffffffffffffa7d;
      str_00._M_str._6_1_ = in_stack_fffffffffffffa7e;
      str_00._M_str._7_1_ = in_stack_fffffffffffffa7f;
      gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_00);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
      key._M_len._1_1_ = in_stack_fffffffffffffaa9;
      key._M_len._0_1_ = in_stack_fffffffffffffaa8;
      key._M_len._2_1_ = in_stack_fffffffffffffaaa;
      key._M_len._3_1_ = in_stack_fffffffffffffaab;
      key._M_len._4_1_ = in_stack_fffffffffffffaac;
      key._M_len._5_1_ = in_stack_fffffffffffffaad;
      key._M_len._6_1_ = in_stack_fffffffffffffaae;
      key._M_len._7_1_ = in_stack_fffffffffffffaaf;
      key._M_str = pcVar4;
      addSubscription((Recorder *)
                      CONCAT17(in_stack_fffffffffffffaa7,
                               CONCAT16(in_stack_fffffffffffffaa6,
                                        CONCAT15(in_stack_fffffffffffffaa5,
                                                 CONCAT14(in_stack_fffffffffffffaa4,
                                                          CONCAT13(in_stack_fffffffffffffaa3,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffaa2,
                                                  CONCAT11(in_stack_fffffffffffffaa1,
                                                           in_stack_fffffffffffffaa0))))))),key);
      std::__cxx11::string::~string(in_stack_fffffffffffffa30);
    }
    else if (pcVar4 == (char *)0x2) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_270,0);
      in_stack_fffffffffffffaaf =
           std::operator==(in_stack_fffffffffffffa30,
                           (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      if (!(bool)in_stack_fffffffffffffaaf) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_270,0);
        in_stack_fffffffffffffaae =
             std::operator==(in_stack_fffffffffffffa30,
                             (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        if (!(bool)in_stack_fffffffffffffaae) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_270,0);
          in_stack_fffffffffffffaad =
               std::operator==(in_stack_fffffffffffffa30,
                               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28)
                              );
          if (!(bool)in_stack_fffffffffffffaad) {
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_270,0);
            in_stack_fffffffffffffaac =
                 std::operator==(in_stack_fffffffffffffa30,
                                 (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                  in_stack_fffffffffffffa28));
            if (!(bool)in_stack_fffffffffffffaac) {
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_270,0);
              in_stack_fffffffffffffaab =
                   std::operator==(in_stack_fffffffffffffa30,
                                   (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                    in_stack_fffffffffffffa28));
              if (!(bool)in_stack_fffffffffffffaab) {
                CLI::std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&local_270,0);
                in_stack_fffffffffffffaaa =
                     std::operator==(in_stack_fffffffffffffa30,
                                     (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                      in_stack_fffffffffffffa28));
                if (!(bool)in_stack_fffffffffffffaaa) {
                  CLI::std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](&local_270,0);
                  in_stack_fffffffffffffaa9 =
                       std::operator==(in_stack_fffffffffffffa30,
                                       (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                        in_stack_fffffffffffffa28));
                  if (!(bool)in_stack_fffffffffffffaa9) {
                    CLI::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_270,0);
                    in_stack_fffffffffffffaa8 =
                         std::operator==(in_stack_fffffffffffffa30,
                                         (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                          in_stack_fffffffffffffa28));
                    if (!(bool)in_stack_fffffffffffffaa8) {
                      CLI::std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](&local_270,0);
                      in_stack_fffffffffffffaa7 =
                           std::operator==(in_stack_fffffffffffffa30,
                                           (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                            in_stack_fffffffffffffa28));
                      if (!(bool)in_stack_fffffffffffffaa7) {
                        CLI::std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&local_270,0);
                        in_stack_fffffffffffffaa6 =
                             std::operator==(in_stack_fffffffffffffa30,
                                             (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                              in_stack_fffffffffffffa28));
                        if (!(bool)in_stack_fffffffffffffaa6) {
                          CLI::std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&local_270,0);
                          in_stack_fffffffffffffaa5 =
                               std::operator==(in_stack_fffffffffffffa30,
                                               (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                                in_stack_fffffffffffffa28));
                          if (!(bool)in_stack_fffffffffffffaa5) {
                            CLI::std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](&local_270,0);
                            in_stack_fffffffffffffaa4 =
                                 std::operator==(in_stack_fffffffffffffa30,
                                                 (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                                  in_stack_fffffffffffffa28));
                            if (!(bool)in_stack_fffffffffffffaa4) {
                              CLI::std::
                              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ::operator[](&local_270,0);
                              in_stack_fffffffffffffaa3 =
                                   std::operator==(in_stack_fffffffffffffa30,
                                                   (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                                    in_stack_fffffffffffffa28));
                              if (!(bool)in_stack_fffffffffffffaa3) {
                                CLI::std::
                                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ::operator[](&local_270,0);
                                in_stack_fffffffffffffaa2 =
                                     std::operator==(in_stack_fffffffffffffa30,
                                                     (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                                      in_stack_fffffffffffffa28));
                                if ((bool)in_stack_fffffffffffffaa2) {
                                  CLI::std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[](&local_270,1);
                                  std::__cxx11::string::operator_cast_to_basic_string_view
                                            (in_stack_fffffffffffffa30);
                                  str_05._M_str._0_4_ = in_stack_fffffffffffffa78;
                                  str_05._M_len = (size_t)in_stack_fffffffffffffa70;
                                  str_05._M_str._4_1_ = in_stack_fffffffffffffa7c;
                                  str_05._M_str._5_1_ = in_stack_fffffffffffffa7d;
                                  str_05._M_str._6_1_ = in_stack_fffffffffffffa7e;
                                  str_05._M_str._7_1_ = in_stack_fffffffffffffa7f;
                                  gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_05);
                                  std::__cxx11::string::operator_cast_to_basic_string_view
                                            (in_stack_fffffffffffffa30);
                                  captureDesc._M_len._4_4_ = in_stack_fffffffffffffa2c;
                                  captureDesc._M_len._0_4_ = in_stack_fffffffffffffa28;
                                  captureDesc._M_str = (char *)in_stack_fffffffffffffa30;
                                  addCapture((Recorder *)0x20f1d0,captureDesc);
                                  std::__cxx11::string::~string(in_stack_fffffffffffffa30);
                                }
                                else {
                                  CLI::std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[](&local_270,0);
                                  in_stack_fffffffffffffaa1 =
                                       std::operator==(in_stack_fffffffffffffa30,
                                                       (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                                        in_stack_fffffffffffffa28));
                                  if ((bool)in_stack_fffffffffffffaa1) {
                                    CLI::std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](&local_270,1);
                                    std::__cxx11::string::operator_cast_to_basic_string_view
                                              (in_stack_fffffffffffffa30);
                                    str_06._M_str._0_4_ = in_stack_fffffffffffffa78;
                                    str_06._M_len = (size_t)in_stack_fffffffffffffa70;
                                    str_06._M_str._4_1_ = in_stack_fffffffffffffa7c;
                                    str_06._M_str._5_1_ = in_stack_fffffffffffffa7d;
                                    str_06._M_str._6_1_ = in_stack_fffffffffffffa7e;
                                    str_06._M_str._7_1_ = in_stack_fffffffffffffa7f;
                                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_06);
                                    std::__cxx11::string::operator_cast_to_basic_string_view
                                              (in_stack_fffffffffffffa30);
                                    sourceEndpoint_00._M_len._4_1_ = in_stack_fffffffffffffa7c;
                                    sourceEndpoint_00._M_len._0_4_ = in_stack_fffffffffffffa78;
                                    sourceEndpoint_00._M_len._5_1_ = in_stack_fffffffffffffa7d;
                                    sourceEndpoint_00._M_len._6_1_ = in_stack_fffffffffffffa7e;
                                    sourceEndpoint_00._M_len._7_1_ = in_stack_fffffffffffffa7f;
                                    sourceEndpoint_00._M_str = (char *)in_stack_fffffffffffffa80;
                                    addSourceEndpointClone
                                              (in_stack_fffffffffffffa70,sourceEndpoint_00);
                                    std::__cxx11::string::~string(in_stack_fffffffffffffa30);
                                    CLI::std::
                                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ::operator[](&local_270,1);
                                    std::__cxx11::string::operator_cast_to_basic_string_view
                                              (in_stack_fffffffffffffa30);
                                    str_07._M_str._0_4_ = in_stack_fffffffffffffa78;
                                    str_07._M_len = (size_t)in_stack_fffffffffffffa70;
                                    str_07._M_str._4_1_ = in_stack_fffffffffffffa7c;
                                    str_07._M_str._5_1_ = in_stack_fffffffffffffa7d;
                                    str_07._M_str._6_1_ = in_stack_fffffffffffffa7e;
                                    str_07._M_str._7_1_ = in_stack_fffffffffffffa7f;
                                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_07);
                                    std::__cxx11::string::operator_cast_to_basic_string_view
                                              (in_stack_fffffffffffffa30);
                                    destEndpoint_00._M_len._4_1_ = in_stack_fffffffffffffa7c;
                                    destEndpoint_00._M_len._0_4_ = in_stack_fffffffffffffa78;
                                    destEndpoint_00._M_len._5_1_ = in_stack_fffffffffffffa7d;
                                    destEndpoint_00._M_len._6_1_ = in_stack_fffffffffffffa7e;
                                    destEndpoint_00._M_len._7_1_ = in_stack_fffffffffffffa7f;
                                    destEndpoint_00._M_str = (char *)in_stack_fffffffffffffa80;
                                    addDestEndpointClone(in_stack_fffffffffffffa70,destEndpoint_00);
                                    std::__cxx11::string::~string(in_stack_fffffffffffffa30);
                                  }
                                  else {
                                    in_stack_fffffffffffffa98 =
                                         std::operator<<((ostream *)&std::cerr,
                                                         "Unable to process line ");
                                    in_stack_fffffffffffffa90 =
                                         (Recorder *)
                                         std::ostream::operator<<
                                                   (in_stack_fffffffffffffa98,local_23c);
                                    poVar5 = std::operator<<((ostream *)in_stack_fffffffffffffa90,
                                                             ':');
                                    in_stack_fffffffffffffa80 = std::operator<<(poVar5,local_238);
                                    std::operator<<(in_stack_fffffffffffffa80,'\n');
                                  }
                                }
                                goto LAB_0020f79c;
                              }
                            }
                          }
                          CLI::std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&local_270,1);
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    (in_stack_fffffffffffffa30);
                          str_04._M_str._0_4_ = in_stack_fffffffffffffa78;
                          str_04._M_len = (size_t)in_stack_fffffffffffffa70;
                          str_04._M_str._4_1_ = in_stack_fffffffffffffa7c;
                          str_04._M_str._5_1_ = in_stack_fffffffffffffa7d;
                          str_04._M_str._6_1_ = in_stack_fffffffffffffa7e;
                          str_04._M_str._7_1_ = in_stack_fffffffffffffa7f;
                          gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_04);
                          std::__cxx11::string::operator_cast_to_basic_string_view
                                    (in_stack_fffffffffffffa30);
                          destEndpoint._M_len._4_1_ = in_stack_fffffffffffffa7c;
                          destEndpoint._M_len._0_4_ = in_stack_fffffffffffffa78;
                          destEndpoint._M_len._5_1_ = in_stack_fffffffffffffa7d;
                          destEndpoint._M_len._6_1_ = in_stack_fffffffffffffa7e;
                          destEndpoint._M_len._7_1_ = in_stack_fffffffffffffa7f;
                          destEndpoint._M_str = (char *)in_stack_fffffffffffffa80;
                          addDestEndpointClone(in_stack_fffffffffffffa70,destEndpoint);
                          std::__cxx11::string::~string(in_stack_fffffffffffffa30);
                          goto LAB_0020f79c;
                        }
                      }
                    }
                    CLI::std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](&local_270,1);
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffa30);
                    str_03._M_str._0_4_ = in_stack_fffffffffffffa78;
                    str_03._M_len = (size_t)in_stack_fffffffffffffa70;
                    str_03._M_str._4_1_ = in_stack_fffffffffffffa7c;
                    str_03._M_str._5_1_ = in_stack_fffffffffffffa7d;
                    str_03._M_str._6_1_ = in_stack_fffffffffffffa7e;
                    str_03._M_str._7_1_ = in_stack_fffffffffffffa7f;
                    gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_03);
                    std::__cxx11::string::operator_cast_to_basic_string_view
                              (in_stack_fffffffffffffa30);
                    sourceEndpoint._M_len._4_1_ = in_stack_fffffffffffffa7c;
                    sourceEndpoint._M_len._0_4_ = in_stack_fffffffffffffa78;
                    sourceEndpoint._M_len._5_1_ = in_stack_fffffffffffffa7d;
                    sourceEndpoint._M_len._6_1_ = in_stack_fffffffffffffa7e;
                    sourceEndpoint._M_len._7_1_ = in_stack_fffffffffffffa7f;
                    sourceEndpoint._M_str = (char *)in_stack_fffffffffffffa80;
                    addSourceEndpointClone(in_stack_fffffffffffffa70,sourceEndpoint);
                    std::__cxx11::string::~string(in_stack_fffffffffffffa30);
                    goto LAB_0020f79c;
                  }
                }
              }
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_270,1);
              std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
              str_02._M_str._0_4_ = in_stack_fffffffffffffa78;
              str_02._M_len = (size_t)in_stack_fffffffffffffa70;
              str_02._M_str._4_1_ = in_stack_fffffffffffffa7c;
              str_02._M_str._5_1_ = in_stack_fffffffffffffa7d;
              str_02._M_str._6_1_ = in_stack_fffffffffffffa7e;
              str_02._M_str._7_1_ = in_stack_fffffffffffffa7f;
              gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_02);
              std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
              endpoint._M_str._0_1_ = in_stack_fffffffffffffaa0;
              endpoint._M_len = (size_t)in_stack_fffffffffffffa98;
              endpoint._M_str._1_1_ = in_stack_fffffffffffffaa1;
              endpoint._M_str._2_1_ = in_stack_fffffffffffffaa2;
              endpoint._M_str._3_1_ = in_stack_fffffffffffffaa3;
              endpoint._M_str._4_1_ = in_stack_fffffffffffffaa4;
              endpoint._M_str._5_1_ = in_stack_fffffffffffffaa5;
              endpoint._M_str._6_1_ = in_stack_fffffffffffffaa6;
              endpoint._M_str._7_1_ = in_stack_fffffffffffffaa7;
              addEndpoint(in_stack_fffffffffffffa90,endpoint);
              std::__cxx11::string::~string(in_stack_fffffffffffffa30);
              goto LAB_0020f79c;
            }
          }
        }
      }
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_270,1);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
      str_01._M_str._0_4_ = in_stack_fffffffffffffa78;
      str_01._M_len = (size_t)in_stack_fffffffffffffa70;
      str_01._M_str._4_1_ = in_stack_fffffffffffffa7c;
      str_01._M_str._5_1_ = in_stack_fffffffffffffa7d;
      str_01._M_str._6_1_ = in_stack_fffffffffffffa7e;
      str_01._M_str._7_1_ = in_stack_fffffffffffffa7f;
      gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_01);
      std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
      key_00._M_len._1_1_ = in_stack_fffffffffffffaa9;
      key_00._M_len._0_1_ = in_stack_fffffffffffffaa8;
      key_00._M_len._2_1_ = in_stack_fffffffffffffaaa;
      key_00._M_len._3_1_ = in_stack_fffffffffffffaab;
      key_00._M_len._4_1_ = in_stack_fffffffffffffaac;
      key_00._M_len._5_1_ = in_stack_fffffffffffffaad;
      key_00._M_len._6_1_ = in_stack_fffffffffffffaae;
      key_00._M_len._7_1_ = in_stack_fffffffffffffaaf;
      key_00._M_str = pcVar4;
      addSubscription((Recorder *)
                      CONCAT17(in_stack_fffffffffffffaa7,
                               CONCAT16(in_stack_fffffffffffffaa6,
                                        CONCAT15(in_stack_fffffffffffffaa5,
                                                 CONCAT14(in_stack_fffffffffffffaa4,
                                                          CONCAT13(in_stack_fffffffffffffaa3,
                                                                   CONCAT12(
                                                  in_stack_fffffffffffffaa2,
                                                  CONCAT11(in_stack_fffffffffffffaa1,
                                                           in_stack_fffffffffffffaa0))))))),key_00);
      std::__cxx11::string::~string(in_stack_fffffffffffffa30);
    }
    else if (pcVar4 == (char *)0x3) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_270,0);
      in_stack_fffffffffffffa7f =
           std::operator==(in_stack_fffffffffffffa30,
                           (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
      if ((bool)in_stack_fffffffffffffa7f) {
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_270,1);
        in_stack_fffffffffffffa7e =
             std::operator==(in_stack_fffffffffffffa30,
                             (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28));
        if (!(bool)in_stack_fffffffffffffa7e) {
          CLI::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](&local_270,1);
          in_stack_fffffffffffffa7d =
               std::operator==(in_stack_fffffffffffffa30,
                               (char *)CONCAT44(in_stack_fffffffffffffa2c,in_stack_fffffffffffffa28)
                              );
          if (!(bool)in_stack_fffffffffffffa7d) {
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_270,1);
            in_stack_fffffffffffffa7c =
                 std::operator==(in_stack_fffffffffffffa30,
                                 (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                  in_stack_fffffffffffffa28));
            if (!(bool)in_stack_fffffffffffffa7c) {
              CLI::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&local_270,1);
              bVar1 = std::operator==(in_stack_fffffffffffffa30,
                                      (char *)CONCAT44(in_stack_fffffffffffffa2c,
                                                       in_stack_fffffffffffffa28));
              in_stack_fffffffffffffa78 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffa78);
              if (!bVar1) {
                in_stack_fffffffffffffa70 =
                     (Recorder *)std::operator<<((ostream *)&std::cerr,"Unable to process line ");
                in_stack_fffffffffffffa68 =
                     (ostream *)std::ostream::operator<<(in_stack_fffffffffffffa70,local_23c);
                in_stack_fffffffffffffa60 = std::operator<<(in_stack_fffffffffffffa68,':');
                poVar5 = std::operator<<(in_stack_fffffffffffffa60,local_238);
                std::operator<<(poVar5,'\n');
                goto LAB_0020f79c;
              }
            }
            CLI::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_270,2);
            std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
            str_09._M_str._0_4_ = in_stack_fffffffffffffa78;
            str_09._M_len = (size_t)in_stack_fffffffffffffa70;
            str_09._M_str._4_1_ = in_stack_fffffffffffffa7c;
            str_09._M_str._5_1_ = in_stack_fffffffffffffa7d;
            str_09._M_str._6_1_ = in_stack_fffffffffffffa7e;
            str_09._M_str._7_1_ = in_stack_fffffffffffffa7f;
            gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_09);
            std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
            destEndpoint_01._M_len._4_1_ = in_stack_fffffffffffffa7c;
            destEndpoint_01._M_len._0_4_ = in_stack_fffffffffffffa78;
            destEndpoint_01._M_len._5_1_ = in_stack_fffffffffffffa7d;
            destEndpoint_01._M_len._6_1_ = in_stack_fffffffffffffa7e;
            destEndpoint_01._M_len._7_1_ = in_stack_fffffffffffffa7f;
            destEndpoint_01._M_str = (char *)in_stack_fffffffffffffa80;
            addDestEndpointClone(in_stack_fffffffffffffa70,destEndpoint_01);
            std::__cxx11::string::~string(in_stack_fffffffffffffa30);
            goto LAB_0020f79c;
          }
        }
        CLI::std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator[](&local_270,2);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
        str_08._M_str._0_4_ = in_stack_fffffffffffffa78;
        str_08._M_len = (size_t)in_stack_fffffffffffffa70;
        str_08._M_str._4_1_ = in_stack_fffffffffffffa7c;
        str_08._M_str._5_1_ = in_stack_fffffffffffffa7d;
        str_08._M_str._6_1_ = in_stack_fffffffffffffa7e;
        str_08._M_str._7_1_ = in_stack_fffffffffffffa7f;
        gmlc::utilities::stringOps::removeQuotes_abi_cxx11_(str_08);
        std::__cxx11::string::operator_cast_to_basic_string_view(in_stack_fffffffffffffa30);
        sourceEndpoint_01._M_len._4_1_ = in_stack_fffffffffffffa7c;
        sourceEndpoint_01._M_len._0_4_ = in_stack_fffffffffffffa78;
        sourceEndpoint_01._M_len._5_1_ = in_stack_fffffffffffffa7d;
        sourceEndpoint_01._M_len._6_1_ = in_stack_fffffffffffffa7e;
        sourceEndpoint_01._M_len._7_1_ = in_stack_fffffffffffffa7f;
        sourceEndpoint_01._M_str = (char *)in_stack_fffffffffffffa80;
        addSourceEndpointClone(in_stack_fffffffffffffa70,sourceEndpoint_01);
        std::__cxx11::string::~string(in_stack_fffffffffffffa30);
      }
      else {
        in_stack_fffffffffffffa50 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<((ostream *)&std::cerr,"Unable to process line ");
        in_stack_fffffffffffffa48 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffffa50,local_23c);
        in_stack_fffffffffffffa40 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::operator<<(in_stack_fffffffffffffa48,':');
        in_stack_fffffffffffffa38 = std::operator<<((ostream *)in_stack_fffffffffffffa40,local_238);
        std::operator<<(in_stack_fffffffffffffa38,'\n');
      }
    }
LAB_0020f79c:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffa40);
  } while( true );
}

Assistant:

void Recorder::loadTextFile(const std::string& textFile)
{
    using namespace gmlc::utilities::stringOps;  // NOLINT

    std::ifstream infile(textFile);
    std::string str;
    int lineCount = 0;
    while (std::getline(infile, str)) {
        ++lineCount;
        if (str.empty()) {
            continue;
        }
        auto firstChar = str.find_first_not_of(" \t\n\r\0");
        if ((firstChar == std::string::npos) || (str[firstChar] == '#')) {
            continue;
        }
        auto blk = splitlineQuotes(str, ",\t ", default_quote_chars, delimiter_compression::on);

        switch (blk.size()) {
            case 1:
                addSubscription(removeQuotes(blk[0]));
                break;
            case 2:
                if ((blk[0] == "subscription") || (blk[0] == "s") || (blk[0] == "sub") ||
                    (blk[0] == "tag")) {
                    addSubscription(removeQuotes(blk[1]));
                } else if ((blk[0] == "endpoint") || (blk[0] == "ept") || (blk[0] == "e")) {
                    addEndpoint(removeQuotes(blk[1]));
                } else if ((blk[0] == "sourceclone") || (blk[0] == "source") || (blk[0] == "src")) {
                    addSourceEndpointClone(removeQuotes(blk[1]));
                } else if ((blk[0] == "destclone") || (blk[0] == "dest") ||
                           (blk[0] == "destination")) {
                    addDestEndpointClone(removeQuotes(blk[1]));
                } else if (blk[0] == "capture") {
                    addCapture(removeQuotes(blk[1]));
                } else if (blk[0] == "clone") {
                    addSourceEndpointClone(removeQuotes(blk[1]));
                    addDestEndpointClone(removeQuotes(blk[1]));
                } else {
                    std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                }
                break;
            case 3:
                if (blk[0] == "clone") {
                    if ((blk[1] == "source") || (blk[1] == "src")) {
                        addSourceEndpointClone(removeQuotes(blk[2]));
                    } else if ((blk[1] == "dest") || (blk[1] == "destination")) {
                        addDestEndpointClone(removeQuotes(blk[2]));
                    } else {
                        std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                    }
                } else {
                    std::cerr << "Unable to process line " << lineCount << ':' << str << '\n';
                }
                break;
            default:
                break;
        }
    }
    infile.close();
}